

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O0

void write_to_file(string *file,PFT_PROGRAM_DATA ftData)

{
  undefined1 local_2a8 [8];
  CONFIG_DATA config;
  ofstream output_file;
  PFT_PROGRAM_DATA ftData_local;
  string *file_local;
  
  std::ofstream::ofstream(&config.IsFastSerH,(string *)file,_S_bin);
  ft_to_config((CONFIG_DATA *)local_2a8,ftData);
  std::ostream::write((char *)&config.IsFastSerH,(long)local_2a8);
  std::ostream::write((char *)&config.IsFastSerH,0x1645a0);
  std::ostream::write((char *)&config.IsFastSerH,0x1645c0);
  std::ostream::write((char *)&config.IsFastSerH,0x1645d0);
  std::ostream::write((char *)&config.IsFastSerH,0x164610);
  std::ofstream::close();
  std::ofstream::~ofstream(&config.IsFastSerH);
  return;
}

Assistant:

void write_to_file(const string& file, PFT_PROGRAM_DATA ftData) {
    ofstream output_file(file, ios::binary);
    CONFIG_DATA config;
    ft_to_config(&config, ftData);
    output_file.write((char *) &config, sizeof(CONFIG_DATA));
    output_file.write(ManufacturerBuf, sizeof(ManufacturerBuf));
    output_file.write(ManufacturerIdBuf, sizeof(ManufacturerIdBuf));
    output_file.write(DescriptionBuf, sizeof(DescriptionBuf));
    output_file.write(SerialNumberBuf, sizeof(SerialNumberBuf));
    output_file.close();
}